

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

confirm * __thiscall lest::confirm::operator()(confirm *this,test *testing)

{
  env *__args;
  message *e;
  string local_38 [32];
  test *local_18;
  test *testing_local;
  confirm *this_local;
  
  this->selected = this->selected + 1;
  local_18 = testing;
  testing_local = (test *)this;
  std::__cxx11::string::string(local_38,(string *)testing);
  __args = env::operator()(&this->output,(text *)local_38);
  std::function<void_(lest::env_&)>::operator()(&testing->behaviour,__args);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

confirm & operator()( test testing )
    {
        try
        {
            ++selected; testing.behaviour( output( testing.name ) );
        }
        catch( message const & e )
        {
            ++failures; report( os, e, output.context() );
        }
        return *this;
    }